

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# variable.hpp
# Opt level: O0

rt_expression_interface<double> * __thiscall
viennamath::rt_variable<viennamath::rt_expression_interface<double>_>::diff
          (rt_variable<viennamath::rt_expression_interface<double>_> *this,
          rt_expression_interface<double> *diff_var)

{
  id_type iVar1;
  rt_variable<viennamath::rt_expression_interface<double>_> *local_50;
  rt_variable<viennamath::rt_expression_interface<double>_> *ptr;
  rt_expression_interface<double> *diff_var_local;
  rt_variable<viennamath::rt_expression_interface<double>_> *this_local;
  
  if (diff_var == (rt_expression_interface<double> *)0x0) {
    local_50 = (rt_variable<viennamath::rt_expression_interface<double>_> *)0x0;
  }
  else {
    local_50 = (rt_variable<viennamath::rt_expression_interface<double>_> *)
               __dynamic_cast(diff_var,&rt_expression_interface<double>::typeinfo,
                              &rt_variable<viennamath::rt_expression_interface<double>>::typeinfo,0)
    ;
  }
  if ((local_50 == (rt_variable<viennamath::rt_expression_interface<double>_> *)0x0) ||
     (iVar1 = id(local_50), iVar1 != this->id_)) {
    this_local = (rt_variable<viennamath::rt_expression_interface<double>_> *)operator_new(0x10);
    rt_constant<double,_viennamath::rt_expression_interface<double>_>::rt_constant
              ((rt_constant<double,_viennamath::rt_expression_interface<double>_> *)this_local,0.0);
  }
  else {
    this_local = (rt_variable<viennamath::rt_expression_interface<double>_> *)operator_new(0x10);
    rt_constant<double,_viennamath::rt_expression_interface<double>_>::rt_constant
              ((rt_constant<double,_viennamath::rt_expression_interface<double>_> *)this_local,1.0);
  }
  return &this_local->super_rt_expression_interface<double>;
}

Assistant:

InterfaceType * diff(const InterfaceType * diff_var) const
      {
        const rt_variable<InterfaceType> * ptr = dynamic_cast< const rt_variable<InterfaceType> *>(diff_var);
        if (ptr != NULL)
        {
          //std::cout << "diff variable<" << id << ">: TRUE" << std::endl;
          if (ptr->id() == id_)
            return new rt_constant<numeric_type, InterfaceType>(1);
        }
        //std::cout << "diff variable<" << id << ">: FALSE, is: " << diff_var.get()->str() << std::endl;
        return new rt_constant<numeric_type, InterfaceType>(0);
      }